

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

_Bool mips_cpu_tlb_fill_mips64
                (CPUState *cs,vaddr address,int size,MMUAccessType access_type,int mmu_idx,
                _Bool probe,uintptr_t retaddr)

{
  CPUMIPSState_conflict5 *env;
  int tlb_error;
  hwaddr physical;
  int in_stack_ffffffffffffffb8;
  int local_3c;
  ulong local_38;
  
  env = (CPUMIPSState_conflict5 *)(cs[1].tb_jmp_cache + 0x143);
  tlb_error = get_physical_address
                        (env,&local_38,&local_3c,address,access_type,mmu_idx,
                         in_stack_ffffffffffffffb8);
  if (tlb_error == 0) {
    tlb_set_page_mips64(cs,address & 0xfffffffffffff000,local_38 & 0xfffffffffffff000,local_3c,
                        mmu_idx,0x1000);
  }
  else if (!probe) {
    raise_mmu_exception(env,address,access_type,tlb_error);
    do_raise_exception_err_mips64
              (env,cs->exception_index,*(int *)(cs[1].tb_jmp_cache + 0x90b),retaddr);
  }
  return tlb_error == 0;
}

Assistant:

bool mips_cpu_tlb_fill(CPUState *cs, vaddr address, int size,
                       MMUAccessType access_type, int mmu_idx,
                       bool probe, uintptr_t retaddr)
{
    MIPSCPU *cpu = MIPS_CPU(cs);
    CPUMIPSState *env = &cpu->env;
    hwaddr physical;
    int prot;
    int mips_access_type;
    int ret = TLBRET_BADADDR;

    /* data access */
    /* XXX: put correct access by using cpu_restore_state() correctly */
    mips_access_type = ACCESS_INT;
    ret = get_physical_address(env, &physical, &prot, address,
                               access_type, mips_access_type, mmu_idx);
    switch (ret) {
    case TLBRET_MATCH:
        qemu_log_mask(CPU_LOG_MMU,
                      "%s address=%" VADDR_PRIx " physical " TARGET_FMT_plx
                      " prot %d\n", __func__, address, physical, prot);
        break;
    default:
        qemu_log_mask(CPU_LOG_MMU,
                      "%s address=%" VADDR_PRIx " ret %d\n", __func__, address,
                      ret);
        break;
    }
    if (ret == TLBRET_MATCH) {
        tlb_set_page(cs, address & TARGET_PAGE_MASK,
                     physical & TARGET_PAGE_MASK, prot,
                     mmu_idx, TARGET_PAGE_SIZE);
        return true;
    }
#if !defined(TARGET_MIPS64)
    if ((ret == TLBRET_NOMATCH) && (env->tlb->nb_tlb > 1)) {
        /*
         * Memory reads during hardware page table walking are performed
         * as if they were kernel-mode load instructions.
         */
        int mode = (env->hflags & MIPS_HFLAG_KSU);
        bool ret_walker;
        env->hflags &= ~MIPS_HFLAG_KSU;
        ret_walker = page_table_walk_refill(env, address, access_type, mmu_idx);
        env->hflags |= mode;
        if (ret_walker) {
            ret = get_physical_address(env, &physical, &prot, address,
                                       access_type, mips_access_type, mmu_idx);
            if (ret == TLBRET_MATCH) {
                tlb_set_page(cs, address & TARGET_PAGE_MASK,
                             physical & TARGET_PAGE_MASK, prot,
                             mmu_idx, TARGET_PAGE_SIZE);
                return true;
            }
        }
    }
#endif
    if (probe) {
        return false;
    }

    raise_mmu_exception(env, address, access_type, ret);
    do_raise_exception_err(env, cs->exception_index, env->error_code, retaddr);
}